

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__simple_alpha_weight_4ch(float *decode_buffer,int width_times_channels)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float *decode;
  float *pfVar4;
  float *pfVar5;
  
  pfVar1 = decode_buffer + width_times_channels;
  pfVar4 = decode_buffer;
  if (7 < width_times_channels) {
    do {
      decode_buffer = pfVar4 + 8;
      fVar2 = pfVar4[3];
      fVar3 = pfVar4[7];
      *pfVar4 = fVar2 * *pfVar4;
      pfVar4[1] = fVar2 * pfVar4[1];
      pfVar4[2] = fVar2 * pfVar4[2];
      pfVar4[3] = fVar2 * 1.0;
      pfVar4[4] = fVar3 * pfVar4[4];
      pfVar4[5] = fVar3 * pfVar4[5];
      pfVar4[6] = fVar3 * pfVar4[6];
      pfVar4[7] = fVar3 * 1.0;
      pfVar5 = pfVar4 + 0x10;
      pfVar4 = decode_buffer;
    } while (pfVar5 <= pfVar1);
  }
  if (decode_buffer < pfVar1) {
    fVar2 = decode_buffer[3];
    *decode_buffer = fVar2 * *decode_buffer;
    decode_buffer[1] = fVar2 * decode_buffer[1];
    decode_buffer[2] = fVar2 * decode_buffer[2];
    decode_buffer[3] = fVar2 * 1.0;
  }
  return;
}

Assistant:

static void stbir__simple_alpha_weight_4ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

  #ifdef STBIR_SIMD
  {
    decode += 2 * stbir__simdfX_float_count;
    STBIR_NO_UNROLL_LOOP_START
    while ( decode <= end_decode )
    {
      stbir__simdfX d0,a0,d1,a1;
      STBIR_NO_UNROLL(decode);
      stbir__simdfX_load( d0, decode-2*stbir__simdfX_float_count );
      stbir__simdfX_load( d1, decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count );
      stbir__simdfX_aaa1( a0, d0, STBIR_onesX );
      stbir__simdfX_aaa1( a1, d1, STBIR_onesX );
      stbir__simdfX_mult( d0, d0, a0 );
      stbir__simdfX_mult( d1, d1, a1 );
      stbir__simdfX_store ( decode-2*stbir__simdfX_float_count, d0 );
      stbir__simdfX_store ( decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count, d1 );
      decode += 2 * stbir__simdfX_float_count;
    }
    decode -= 2 * stbir__simdfX_float_count;

    // few last pixels remnants
    #ifdef STBIR_SIMD8
    STBIR_NO_UNROLL_LOOP_START
    while ( decode < end_decode )
    #else
    if ( decode < end_decode )
    #endif
    {
      stbir__simdf d,a;
      stbir__simdf_load( d, decode );
      stbir__simdf_aaa1( a, d, STBIR__CONSTF(STBIR_ones) );
      stbir__simdf_mult( d, d, a );
      stbir__simdf_store ( decode, d );
      decode += 4;
    }
  }

  #else

  while( decode < end_decode )
  {
    float alpha = decode[3];
    decode[0] *= alpha;
    decode[1] *= alpha;
    decode[2] *= alpha;
    decode += 4;
  }

  #endif
}